

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

void __thiscall
EOPlus::Parser::Parser<std::_Deque_iterator<EOPlus::Token,EOPlus::Token&,EOPlus::Token*>>
          (Parser *this,Quest *quest,
          _Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> *begin,
          _Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> *end)

{
  Parser_Token_Server<std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>_>
  *this_00;
  _Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> local_68;
  _Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> local_48;
  _Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> *local_28;
  _Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> *end_local;
  _Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> *begin_local;
  Quest *quest_local;
  Parser *this_local;
  
  this->quest = quest;
  local_28 = end;
  end_local = begin;
  begin_local = (_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> *)quest;
  quest_local = (Quest *)this;
  this_00 = (Parser_Token_Server<std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>_>
             *)operator_new(0xf8);
  std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>::_Deque_iterator
            (&local_48,begin);
  std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>::_Deque_iterator
            (&local_68,end);
  Parser_Token_Server<std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>_>::
  Parser_Token_Server(this_00,&local_48,&local_68);
  std::
  unique_ptr<EOPlus::Parser_Token_Server_Base,std::default_delete<EOPlus::Parser_Token_Server_Base>>
  ::unique_ptr<std::default_delete<EOPlus::Parser_Token_Server_Base>,void>
            ((unique_ptr<EOPlus::Parser_Token_Server_Base,std::default_delete<EOPlus::Parser_Token_Server_Base>>
              *)&this->tok,(pointer)this_00);
  return;
}

Assistant:

Parser(Quest& quest, IT begin, IT end)
				: quest(quest)
				, tok(new Parser_Token_Server<IT>(begin, end))
			{ }